

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer pPVar1;
  __normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  other;
  SectionNode *pSVar2;
  SectionNode *p;
  Ptr<Catch::CumulativeReporterBase::SectionNode> node;
  SectionStats incompleteStats;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_d0;
  Counts local_c8;
  SectionStats local_b0;
  
  local_c8.failedButOk = 0;
  local_c8.passed = 0;
  local_c8.failed = 0;
  SectionStats::SectionStats(&local_b0,sectionInfo,&local_c8,0.0,false);
  local_d0.m_p = (SectionNode *)0x0;
  pPVar1 = (this->m_sectionStack).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar1) {
    if ((this->m_rootSection).m_p == (SectionNode *)0x0) {
      pSVar2 = (SectionNode *)operator_new(0x118);
      (pSVar2->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (pSVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__SectionNode_001d6d48;
      SectionStats::SectionStats(&pSVar2->stats,&local_b0);
      (pSVar2->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pSVar2->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar2->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar2->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar2->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar2->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pSVar2->stdOut)._M_dataplus._M_p = (pointer)&(pSVar2->stdOut).field_2;
      (pSVar2->stdOut)._M_string_length = 0;
      (pSVar2->stdOut).field_2._M_local_buf[0] = '\0';
      (pSVar2->stdErr)._M_dataplus._M_p = (pointer)&(pSVar2->stdErr).field_2;
      (pSVar2->stdErr)._M_string_length = 0;
      (pSVar2->stdErr).field_2._M_local_buf[0] = '\0';
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_rootSection,pSVar2);
    }
    Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,&this->m_rootSection);
  }
  else {
    pSVar2 = pPVar1[-1].m_p;
    local_c8.passed = (size_t)sectionInfo;
    other = std::
            __find_if<__gnu_cxx::__normal_iterator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>*,std::vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>>>>,__gnu_cxx::__ops::_Iter_pred<Catch::CumulativeReporterBase::BySectionInfo>>
                      ((pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pSVar2->childSections).
                       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (other._M_current ==
        (pSVar2->childSections).
        super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p = (SectionNode *)operator_new(0x118);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__SectionNode_001d6d48;
      SectionStats::SectionStats(&p->stats,&local_b0);
      (p->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (p->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (p->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (p->assertions).
      super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (p->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (p->childSections).
      super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (p->stdOut)._M_dataplus._M_p = (pointer)&(p->stdOut).field_2;
      (p->stdOut)._M_string_length = 0;
      (p->stdOut).field_2._M_local_buf[0] = '\0';
      (p->stdErr)._M_dataplus._M_p = (pointer)&(p->stdErr).field_2;
      (p->stdErr)._M_string_length = 0;
      (p->stdErr).field_2._M_local_buf[0] = '\0';
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,p);
      std::
      vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ::push_back(&pSVar2->childSections,&local_d0);
    }
    else {
      Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&local_d0,other._M_current);
    }
  }
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,&local_d0);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=(&this->m_deepestSection,&local_d0);
  if (local_d0.m_p != (SectionNode *)0x0) {
    (*((local_d0.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  SectionStats::~SectionStats(&local_b0);
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            Ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = new SectionNode( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                SectionNode::ChildSections::const_iterator it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = new SectionNode( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = node;
        }